

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_cleanup(fy_emitter *emit)

{
  char *__ptr;
  fy_emitter_state *__ptr_00;
  fy_emit_save_ctx *__ptr_01;
  fy_eventp *fyep;
  
  if ((emit->fyd == (fy_document *)0x0) && (emit->fyds != (fy_document_state *)0x0)) {
    fy_document_state_unref(emit->fyds);
  }
  __ptr = (emit->ea).accum;
  if (__ptr != (emit->ea).inplace && __ptr != (char *)0x0) {
    free(__ptr);
  }
  while( true ) {
    fyep = fy_eventp_list_pop(&emit->queued_events);
    if (fyep == (fy_eventp *)0x0) break;
    fy_eventp_release(fyep);
  }
  __ptr_00 = emit->state_stack;
  if (__ptr_00 != emit->state_stack_inplace && __ptr_00 != (fy_emitter_state *)0x0) {
    free(__ptr_00);
  }
  __ptr_01 = emit->sc_stack;
  if (__ptr_01 != emit->sc_stack_inplace && __ptr_01 != (fy_emit_save_ctx *)0x0) {
    free(__ptr_01);
  }
  fy_diag_unref(emit->diag);
  return;
}

Assistant:

void fy_emit_cleanup(struct fy_emitter *emit) {
    struct fy_eventp *fyep;

    if (!emit->fyd && emit->fyds)
        fy_document_state_unref(emit->fyds);

    fy_emit_accum_cleanup(&emit->ea);

    while ((fyep = fy_eventp_list_pop(&emit->queued_events)) != NULL)
        fy_eventp_release(fyep);

    if (emit->state_stack && emit->state_stack != emit->state_stack_inplace)
        free(emit->state_stack);

    if (emit->sc_stack && emit->sc_stack != emit->sc_stack_inplace)
        free(emit->sc_stack);

    fy_diag_unref(emit->diag);
}